

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_doclick(_glist *x,int xpos,int ypos,int which,int mod,int doit)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint cursornum;
  int iVar5;
  t_text *ptVar6;
  t_gobj *ptVar7;
  t_text *extraout_RAX;
  _glist *p_Var8;
  _outconnect *oc;
  _rtext *p_Var9;
  t_selection *ptVar10;
  t_editor *ptVar11;
  t_gobj *ptVar12;
  void *data;
  byte bVar13;
  _rtext *p_Var14;
  undefined4 in_register_00000084;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int xpos_00;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int x1;
  ulong local_108;
  int y1;
  float local_fc;
  uint local_f8;
  int y2;
  ulong local_f0;
  int x2;
  int local_e0;
  int local_dc;
  _glist *local_d8;
  _glist *local_d0;
  t_float local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  t_linetraverser t;
  
  uVar15 = CONCAT44(in_register_00000084,mod);
  x1 = 0;
  y1 = 0;
  x2 = 0;
  y2 = 0;
  ptVar11 = x->gl_editor;
  if (ptVar11 == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  uVar19 = (ulong)(uint)ypos;
  uVar18 = (ulong)(uint)xpos;
  bVar21 = true;
  if ((which & 2U) == 0) {
    bVar21 = (x->field_0xe8 & 0x20) == 0;
  }
  *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
  local_f0 = 0;
  iVar4 = 1;
  if (mod != 0) {
    if ((ptVar11->e_grab != (t_gobj *)0x0) && (ptVar11->e_keyfn != (t_glistkeyfn)0x0)) {
      local_108 = uVar18;
      (*ptVar11->e_keyfn)(ptVar11->e_grab,&s_,0.0);
      ptVar7 = x->gl_editor->e_grab;
      if (ptVar7 == (t_gobj *)0x0) {
        ptVar6 = (t_text *)0x0;
      }
      else {
        ptVar6 = pd_checkobject(&ptVar7->g_pd);
      }
      if ((ptVar6 != (t_text *)0x0) && ((~ptVar6->field_0x2e & 3) == 0)) {
        gatom_undarken(ptVar6);
      }
      glist_grab(x,(t_gobj *)0x0,(t_glistmotionfn)0x0,(t_glistkeyfn)0x0,0,0);
      uVar18 = local_108;
    }
    iVar4 = 1;
    if ((*(int *)((pd_maininstance.pd_gui)->i_editor + 0x50) == (int)uVar18) &&
       (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x54) == ypos)) {
      local_d0 = x;
      dVar23 = sys_getrealtime();
      iVar4 = 1;
      x = local_d0;
      if (dVar23 - *(double *)((pd_maininstance.pd_gui)->i_editor + 0x48) < 0.25) {
        local_f0 = 1;
        iVar4 = 3;
      }
    }
  }
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 & 0xf7;
  if (mod != 0) {
    ptVar11 = x->gl_editor;
    ptVar11->e_grab = (t_gobj *)0x0;
    puVar1 = &ptVar11->field_0x88;
    *puVar1 = *puVar1 & 0xf8;
  }
  ptVar11 = x->gl_editor;
  if ((ptVar11->field_0x88 & 7) != 0) {
    return;
  }
  local_f8 = which & 1;
  local_fc = (float)(which & 4);
  xpos_00 = (int)uVar18;
  ptVar11->e_xwas = xpos_00;
  ptVar11->e_ywas = ypos;
  if (((which & 8U) == 0) && (bVar21 == true)) {
    if (ptVar11->e_textedfor != (_rtext *)0x0 && mod != 0) {
      ptVar6 = rtext_getowner(ptVar11->e_textedfor);
      iVar3 = canvas_hitbox(x,&ptVar6->te_g,xpos_00,ypos,&x1,&y1,&x2,&y2);
      iVar20 = y1;
      iVar17 = x1;
      p_Var14 = x->gl_editor->e_textedfor;
      if (iVar3 != 0) {
        iVar3 = 4;
        if (local_f8 == 0) {
          iVar3 = iVar4;
        }
        rtext_mouse(p_Var14,xpos_00 - x1,ypos - y1,iVar3);
        x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
        ptVar11 = x->gl_editor;
        ptVar11->e_xwas = iVar17;
        ptVar11->e_ywas = iVar20;
        return;
      }
      rtext_retext(p_Var14);
      rtext_activate(x->gl_editor->e_textedfor,0);
      return;
    }
    ptVar7 = x->gl_list;
    cursornum = 0;
    bVar21 = ptVar7 == (t_gobj *)0x0;
    if (!bVar21) {
      local_fc = (float)((uint)local_fc >> 2);
      local_108 = uVar15;
      do {
        iVar4 = canvas_hitbox(x,ptVar7,xpos_00,ypos,&x1,&y1,&x2,&y2);
        if (iVar4 != 0) {
          if (((which & 2U) == 0) || (fVar22 = 1.4013e-45, (x->field_0xe8 & 0x20) != 0)) {
            fVar22 = local_fc;
          }
          cursornum = gobj_click(ptVar7,x,xpos_00,ypos,local_f8,(int)fVar22,(int)local_f0,
                                 (int)local_108);
          uVar15 = local_108;
          if (cursornum != 0) goto LAB_00140d4c;
        }
        ptVar7 = ptVar7->g_next;
        bVar21 = ptVar7 == (_gobj *)0x0;
      } while (!bVar21);
      cursornum = 0;
      uVar15 = local_108;
    }
LAB_00140d4c:
    if ((int)uVar15 != 0) {
      return;
    }
    if (!bVar21) goto LAB_00140d60;
  }
  else {
    local_f0 = CONCAT71(local_f0._1_7_,bVar21) ^ 1;
    local_108 = uVar15;
    ptVar7 = canvas_findhitbox(x,xpos_00,ypos,&x1,&y1,&x2,&y2);
    if (ptVar7 == (t_gobj *)0x0) {
      ptVar6 = (t_text *)0x0;
    }
    else {
      ptVar6 = pd_checkobject(&ptVar7->g_pd);
    }
    iVar20 = x2;
    iVar17 = (int)local_108;
    if (ptVar7 != (t_gobj *)0x0) {
      if ((which & 8U) != 0) {
        canvas_rightclick(x,xpos_00,ypos,ptVar7);
        return;
      }
      if (local_f8 != 0) {
        if (iVar17 == 0) {
          return;
        }
        if (((ptVar6 == (t_text *)0x0) ||
            (p_Var14 = x->gl_editor->e_textedfor, p_Var14 == (_rtext *)0x0)) ||
           (p_Var9 = glist_findrtext(x,ptVar6), p_Var14 != p_Var9)) {
          if (x->gl_editor != (t_editor *)0x0) {
            for (ptVar10 = x->gl_editor->e_selection; ptVar10 != (t_selection *)0x0;
                ptVar10 = ptVar10->sel_next) {
              if (ptVar10->sel_what == ptVar7) {
                if (ptVar10 != (t_selection *)0x0) {
                  glist_deselect(x,ptVar7);
                  return;
                }
                break;
              }
            }
          }
          glist_select(x,ptVar7);
          return;
        }
        iVar4 = 4;
        goto LAB_00141004;
      }
      local_f0 = CONCAT44(local_f0._4_4_,iVar4);
      if ((xpos_00 < x2 + -4) || (ptVar6 == (t_text *)0x0 || y2 + -4 <= ypos)) {
LAB_00140cac:
        if (ptVar6 != (t_text *)0x0) {
          iVar4 = obj_noutlets(ptVar6);
          iVar17 = (int)local_108;
          if ((iVar4 != 0) && (iVar3 = x->gl_zoom, y2 + iVar3 * -2 <= ypos)) {
            iVar20 = iVar20 - x1;
            iVar16 = 1;
            if (1 < iVar4) {
              iVar16 = iVar4 + -1;
            }
            iVar5 = (iVar20 / 2 + (xpos_00 - x1) * iVar16) / iVar20;
            if (((iVar5 < iVar4) &&
                (iVar4 = ((iVar3 * -7 + iVar20) * iVar5) / iVar16 + x1, iVar4 - iVar3 <= xpos_00))
               && (xpos_00 <= iVar4 + iVar3 * 8)) {
              if (iVar17 != 0) {
                iVar4 = obj_issignaloutlet(ptVar6,iVar5);
                x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 2;
                ptVar11 = x->gl_editor;
                ptVar11->e_xwas = xpos_00;
                ptVar11->e_ywas = ypos;
                pdgui_vmess("::pdtk_canvas::cords_to_foreground","ci",x,0);
                pdgui_vmess((char *)0x0,"crr iiii ri rs",x,"create","line",uVar18 & 0xffffffff,
                            uVar19,uVar18,uVar19,"-width",(ulong)(uint)(x->gl_zoom << (iVar4 != 0)),
                            "-tags","x");
                return;
              }
              cursornum = 5;
              goto LAB_00140d60;
            }
          }
        }
        if (iVar17 != 0) {
          if (((ptVar6 != (t_text *)0x0) &&
              (p_Var14 = x->gl_editor->e_textedfor, p_Var14 != (_rtext *)0x0)) &&
             (p_Var9 = glist_findrtext(x,ptVar6), p_Var14 == p_Var9)) {
            iVar4 = (int)(float)local_f0;
LAB_00141004:
            iVar20 = y1;
            iVar17 = x1;
            rtext_mouse(p_Var14,xpos_00 - x1,ypos - y1,iVar4);
            x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
            ptVar11 = x->gl_editor;
            ptVar11->e_xwas = iVar17;
            ptVar11->e_ywas = iVar20;
            return;
          }
          if (x->gl_editor != (t_editor *)0x0) {
            for (ptVar10 = x->gl_editor->e_selection; ptVar10 != (t_selection *)0x0;
                ptVar10 = ptVar10->sel_next) {
              if (ptVar10->sel_what == ptVar7) {
                if (ptVar10 != (t_selection *)0x0) goto LAB_00140f83;
                break;
              }
            }
          }
          glist_noselect(x);
          glist_select(x,ptVar7);
LAB_00140f83:
          ptVar11 = x->gl_editor;
          bVar13 = (ptVar11->field_0x88 & 0xf8) + 1;
LAB_00140f95:
          ptVar11->field_0x88 = bVar13;
          return;
        }
        cursornum = 4;
      }
      else {
        if ((((ptVar6->te_g).g_pd)->c_wb != &text_widgetbehavior) &&
           ((~ptVar6->field_0x2e & 3) != 0)) {
          p_Var8 = pd_checkglist((t_pd *)ptVar6);
          iVar17 = (int)local_108;
          if (p_Var8 == (_glist *)0x0) goto LAB_00140cac;
        }
        if (iVar17 != 0) {
          if (x->gl_editor != (t_editor *)0x0) {
            for (ptVar10 = x->gl_editor->e_selection; ptVar10 != (t_selection *)0x0;
                ptVar10 = ptVar10->sel_next) {
              if (ptVar10->sel_what == ptVar7) {
                if (ptVar10 != (t_selection *)0x0) goto LAB_00141052;
                break;
              }
            }
          }
          glist_noselect(x);
          glist_select(x,ptVar7);
LAB_00141052:
          x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 6;
          ptVar11 = x->gl_editor;
          ptVar11->e_xwas = x1;
          ptVar11->e_ywas = y1;
          ptVar11->e_xnew = xpos_00;
          ptVar11->e_ynew = ypos;
          ptVar12 = x->gl_list;
          iVar4 = 0;
          if (ptVar12 != ptVar7 && ptVar12 != (t_gobj *)0x0) {
            iVar4 = 0;
            do {
              iVar4 = iVar4 + 1;
              ptVar12 = ptVar12->g_next;
              if (ptVar12 == (_gobj *)0x0) break;
            } while (ptVar12 != ptVar7);
          }
          data = canvas_undo_set_apply(x,iVar4);
          canvas_undo_add(x,UNDO_APPLY,"resize",data);
          return;
        }
        cursornum = 7;
      }
      goto LAB_00140d60;
    }
    if ((which & 8U) != 0) {
      pdgui_vmess("pdtk_canvas_popup","^ ii ii",x,uVar18 & 0xffffffff,(ulong)(uint)ypos,1,0);
      iVar17 = (int)local_108;
      ptVar6 = extraout_RAX;
    }
    bVar21 = (which & 8U) == 0;
    if (((byte)local_f0 & bVar21) != 0) {
      if (local_fc == 0.0) {
        local_d8 = glist_getcanvas((_glist *)CONCAT71((int7)((ulong)ptVar6 >> 8),bVar21));
        linetraverser_start(&t,local_d8);
        oc = linetraverser_next(&t);
        if (oc == (_outconnect *)0x0) {
          iVar17 = (int)local_108;
        }
        else {
          local_f0 = CONCAT44(local_f0._4_4_,(float)xpos_00);
          local_fc = (float)ypos;
          do {
            p_Var8 = local_d8;
            iVar17 = (int)local_108;
            fVar22 = (float)t.tr_lx2 - (float)t.tr_lx1;
            fVar25 = local_fc - (float)t.tr_ly1;
            fVar24 = (float)t.tr_ly2 - (float)t.tr_ly1;
            fVar26 = (float)local_f0 - (float)t.tr_lx1;
            fVar27 = fVar22 * fVar25 - fVar26 * fVar24;
            iVar4 = 6;
            if (((fVar27 * fVar27 < (fVar22 * fVar22 + fVar24 * fVar24) * 50.0) &&
                (0.0 <= fVar26 * fVar22 + fVar25 * fVar24)) &&
               (0.0 <= fVar22 * ((float)t.tr_lx2 - (float)local_f0) +
                       fVar24 * ((float)t.tr_ly2 - local_fc))) {
              iVar20 = canvas_getindex(local_d8,&(t.tr_ob)->te_g);
              iVar3 = canvas_getindex(p_Var8,&(t.tr_ob2)->te_g);
              if (local_f8 == 0) {
                if ((int)local_108 != 0) {
                  glist_noselect(x);
LAB_001409fd:
                  glist_selectline(local_d8,oc,iVar20,t.tr_outno,iVar3,t.tr_inno);
                }
              }
              else {
                ptVar11 = x->gl_editor;
                if ((ptVar11->field_0x88 & 0x20) == 0) {
                  if ((int)local_108 != 0) goto LAB_001409fd;
                }
                else {
                  iVar16 = ptVar11->e_selectline_index1;
                  iVar5 = ptVar11->e_selectline_index2;
                  iVar2 = ptVar11->e_selectline_inno;
                  if ((((iVar20 == iVar16) && (iVar3 == iVar5)) &&
                      (ptVar11->e_selectline_outno == t.tr_outno)) && (iVar2 == t.tr_inno)) {
                    if (ptVar11 != (t_editor *)0x0 && (int)local_108 != 0) {
                      ptVar11->field_0x88 = ptVar11->field_0x88 & 0xdf;
                      _editor_selectlinecolor(x,"black");
                    }
                  }
                  else {
                    iVar4 = 0;
                    iVar17 = (int)local_108;
                    if ((ptVar11->e_selection != (t_selection *)0x0) ||
                       (iVar4 = 0, iVar20 != iVar16 && iVar3 != iVar5)) goto LAB_00140a19;
                    if ((int)local_108 != 0) {
                      local_e0 = ptVar11->e_selectline_outno;
                      local_dc = iVar16;
                      local_d0 = x;
                      local_c0 = iVar3;
                      canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
                      p_Var8 = local_d0;
                      local_ac = (float)local_dc;
                      local_b0 = (float)local_e0;
                      local_b4 = (float)iVar5;
                      local_b8 = (float)iVar2;
                      canvas_disconnect_with_undo(local_d0,local_ac,local_b0,local_b4,local_b8);
                      iVar4 = local_c0;
                      local_c4 = (t_float)iVar20;
                      local_bc = (float)local_c0;
                      canvas_disconnect_with_undo
                                (p_Var8,local_c4,(float)t.tr_outno,local_bc,(float)t.tr_inno);
                      canvas_connect_with_undo(p_Var8,local_c4,(float)t.tr_outno,local_b4,local_b8);
                      canvas_connect_with_undo(p_Var8,local_ac,local_b0,local_bc,(float)t.tr_inno);
                      canvas_undo_add(p_Var8,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
                      ptVar11 = p_Var8->gl_editor;
                      ptVar11->e_selectline_index1 = local_dc;
                      ptVar11->e_selectline_outno = local_e0;
                      ptVar11->e_selectline_index2 = iVar4;
                      ptVar11->e_selectline_inno = t.tr_inno;
                      canvas_dirty(p_Var8,1.0);
                    }
                  }
                }
              }
              canvas_setcursor(x,6);
              iVar4 = 1;
              iVar17 = (int)local_108;
            }
LAB_00140a19:
            if ((iVar4 != 6) && (iVar4 != 0)) goto LAB_00140d82;
            oc = linetraverser_next(&t);
            iVar17 = (int)local_108;
          } while (oc != (_outconnect *)0x0);
          iVar4 = 0;
LAB_00140d82:
          if (iVar4 != 0) {
            return;
          }
        }
      }
      canvas_setcursor(x,4);
      if (iVar17 == 0) {
        return;
      }
      if (local_f8 == 0) {
        glist_noselect(x);
      }
      pdgui_vmess((char *)0x0,"crr iiii rs",x,"create","rectangle",uVar18 & 0xffffffff,uVar19,uVar18
                  ,uVar19,"-tags","x");
      ptVar11 = x->gl_editor;
      ptVar11->e_xwas = xpos_00;
      ptVar11->e_ywas = ypos;
      bVar13 = ptVar11->field_0x88 & 0xf8 | 3;
      goto LAB_00140f95;
    }
  }
  cursornum = 0;
LAB_00140d60:
  canvas_setcursor(x,cursornum);
  return;
}

Assistant:

static void canvas_doclick(t_canvas *x, int xpos, int ypos, int which,
    int mod, int doit)
{
    t_gobj *hitbox;
    int shiftmod, runmode, altmod, doublemod = 0, rightclick;
    int x1=0, y1=0, x2=0, y2=0, clickreturned = 0;
    t_text *hitobj;

    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    shiftmod = (mod & SHIFTMOD);
    runmode = ((mod & CTRLMOD) || (!x->gl_edit));
    altmod = (mod & ALTMOD);
    rightclick = (mod & RIGHTCLICK);

    EDITOR->canvas_undo_already_set_move = 0;

        /* if keyboard was grabbed, notify grabber and cancel the grab */
    if (doit && x->gl_editor->e_grab && x->gl_editor->e_keyfn)
    {
        (* x->gl_editor->e_keyfn) (x->gl_editor->e_grab, &s_, 0);
        undarken_if_gatom(x->gl_editor->e_grab);
        glist_grab(x, 0, 0, 0, 0, 0);
    }

    if (doit && xpos == EDITOR->canvas_upx &&
        ypos == EDITOR->canvas_upy &&
        sys_getrealtime() - EDITOR->canvas_upclicktime < DCLICKINTERVAL)
            doublemod = 1;
    x->gl_editor->e_lastmoved = 0;
    if (doit)
    {
        x->gl_editor->e_grab = 0;
        x->gl_editor->e_onmotion = MA_NONE;
    }
#if 0
    post("click %d %d %d %d", xpos, ypos, which, mod);
#endif

    if (x->gl_editor->e_onmotion != MA_NONE)
        return;

    x->gl_editor->e_xwas = xpos;
    x->gl_editor->e_ywas = ypos;

    if (runmode && !rightclick)
    {
            /* is a text activated ? */
        if (x->gl_editor->e_textedfor  && doit)
        {
            hitobj = rtext_getowner(x->gl_editor->e_textedfor);
            if (canvas_hitbox(x, &hitobj->te_g,
                xpos, ypos, &x1, &y1, &x2, &y2))
            {
                rtext_mouse(x->gl_editor->e_textedfor, xpos - x1, ypos - y1,
                    (shiftmod? RTEXT_SHIFT :
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN)));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
            }
            else
            {
                rtext_retext(x->gl_editor->e_textedfor);
                rtext_activate(x->gl_editor->e_textedfor, 0);
            }
            return;
        }
        for (hitbox = x->gl_list; hitbox; hitbox = hitbox->g_next)
        {
                /* check if the object wants to be clicked */
            if (canvas_hitbox(x, hitbox, xpos, ypos, &x1, &y1, &x2, &y2)
                && (clickreturned = gobj_click(hitbox, x, xpos, ypos,
                    shiftmod, ((mod & CTRLMOD) && (!x->gl_edit)) || altmod,
                        doublemod, doit)))
                            break;
        }
        if (!doit)
        {
            if (hitbox)
                canvas_setcursor(x, clickreturned);
            else canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        }
        return;
    }
        /* if not a runmode left click, fall here. */
    hitbox = canvas_findhitbox(x, xpos, ypos, &x1, &y1, &x2, &y2);
    hitobj = (hitbox ? pd_checkobject(&hitbox->g_pd) : 0);
        /* if text is activated while we're in locked state, this must
        be a number box - so if we clicked outside the box, deactivate it.
        This is a different situation from the "deselect" action below
        when we're unlocked.  */
    /* if (doit) post("%d %x %x %x", x->gl_edit, x->gl_editor->e_textedfor,
        hitobj, (hitobj ? glist_findrtext(x, hitobj) : 0));
    if (doit && (!x->gl_edit) && x->gl_editor->e_textedfor &&
        (!hitobj || (glist_findrtext(x, hitobj) != x->gl_editor->e_textedfor)))
            rtext_activate(x->gl_editor->e_textedfor, 0);   */
    if (hitbox)
    {
            /* we're in a rectangle */
        if (rightclick)
            canvas_rightclick(x, xpos, ypos, hitbox);
        else if (shiftmod)
        {
            if (doit)
            {
                t_rtext *rt;
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1, RTEXT_SHIFT);
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                    if (glist_isselected(x, hitbox))
                        glist_deselect(x, hitbox);
                    else glist_select(x, hitbox);
                }
            }
        }
        else
        {
            int noutlet;
                /* resize? only for "true" text boxes or canvases */
            if (xpos >= x2-4 && ypos < y2-4 && hitobj &&
                    (hitobj->te_pd->c_wb == &text_widgetbehavior ||
                    hitobj->te_type == T_ATOM ||
                    pd_checkglist(&hitobj->te_pd)))
            {
                if (doit)
                {
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_RESIZE;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                    x->gl_editor->e_xnew = xpos;
                    x->gl_editor->e_ynew = ypos;
                    canvas_undo_add(x, UNDO_APPLY, "resize",
                        canvas_undo_set_apply(x, glist_getindex(x, hitbox)));
                }
                else canvas_setcursor(x, CURSOR_EDITMODE_RESIZE);
            }
                /* look for an outlet */
            else if (hitobj && (noutlet = obj_noutlets(hitobj)) &&
                ypos >= y2 - (OHEIGHT*x->gl_zoom) + x->gl_zoom)
            {
                int width = x2 - x1;
                int iow = IOWIDTH * x->gl_zoom;
                int nout1 = (noutlet > 1 ? noutlet - 1 : 1);
                int closest = ((xpos-x1) * (nout1) + width/2)/width;
                int hotspot = x1 +
                    (width - iow) * closest / (nout1);
                if (closest < noutlet &&
                    xpos >= (hotspot - x->gl_zoom) &&
                    xpos <= hotspot + (iow + x->gl_zoom))
                {
                    if (doit)
                    {
                        int issignal = obj_issignaloutlet(hitobj, closest);
                        x->gl_editor->e_onmotion = MA_CONNECT;
                        x->gl_editor->e_xwas = xpos;
                        x->gl_editor->e_ywas = ypos;
                        pdgui_vmess("::pdtk_canvas::cords_to_foreground", "ci", x, 0);
                        pdgui_vmess(0, "crr iiii ri rs",
                            x, "create", "line",
                            xpos,ypos, xpos,ypos,
                            "-width", (issignal ? 2 : 1) * x->gl_zoom,
                            "-tags", "x");
                    }
                    else canvas_setcursor(x, CURSOR_EDITMODE_CONNECT);
                }
                else if (doit)
                    goto nooutletafterall;
                else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
            }
                /* not in an outlet; select and move */
            else if (doit)
            {
                t_rtext *rt;
                    /* check if the box is being text edited */
            nooutletafterall:
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1,
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                        /* otherwise select and drag to displace */
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_MOVE;
                }
            }
            else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
        }
        return;
    }
        /* if right click doesn't hit any boxes, call rightclick
           routine anyway */
    if (rightclick)
        canvas_rightclick(x, xpos, ypos, 0);

        /* if not an editing action, and if we didn't hit a
           box, set cursor and return */
    if (runmode || rightclick)
    {
        canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        return;
    }
        /* having failed to find a box, we try lines now. */
    if (!runmode && !altmod)
    {
        t_linetraverser t;
        t_outconnect *oc;
        t_float fx = xpos, fy = ypos;
        t_glist *glist2 = glist_getcanvas(x);
        linetraverser_start(&t, glist2);
        while ((oc = linetraverser_next(&t)))
        {
            int outindex, inindex;
            t_float lx1 = t.tr_lx1, ly1 = t.tr_ly1,
                lx2 = t.tr_lx2, ly2 = t.tr_ly2;
            t_float area = (lx2 - lx1) * (fy - ly1) -
                (ly2 - ly1) * (fx - lx1);
            t_float dsquare = (lx2-lx1) * (lx2-lx1) + (ly2-ly1) * (ly2-ly1);
            if (area * area >= 50 * dsquare) continue;
            if ((lx2-lx1) * (fx-lx1) + (ly2-ly1) * (fy-ly1) < 0) continue;
            if ((lx2-lx1) * (lx2-fx) + (ly2-ly1) * (ly2-fy) < 0) continue;
            outindex = canvas_getindex(glist2, &t.tr_ob->ob_g);
            inindex = canvas_getindex(glist2, &t.tr_ob2->ob_g);
            if (shiftmod)
            {
                int soutindex, sinindex, soutno, sinno;
                    /* if no line is selected, just add this line to the selection */
                if(!x->gl_editor->e_selectedline)
                {
                    if (doit)
                    {
                        glist_selectline(glist2, oc,
                            outindex, t.tr_outno,
                            inindex, t.tr_inno);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
                soutindex = x->gl_editor->e_selectline_index1;
                sinindex = x->gl_editor->e_selectline_index2;
                soutno = x->gl_editor->e_selectline_outno;
                sinno = x->gl_editor->e_selectline_inno;
                        /* if the hovered line is already selected, deselect it */
                if ((outindex == soutindex) && (inindex == sinindex)
                    && (soutno == t.tr_outno) && (sinno == t.tr_inno))
                {
                    if(doit)
                        glist_deselectline(x);
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }

                    /* swap selected and hovered connection */
                if ((!x->gl_editor->e_selection)
                    && ((outindex == soutindex) || (inindex == sinindex)))
                {
                    if(doit)
                    {
                        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                        canvas_disconnect_with_undo(x, soutindex, soutno, sinindex, sinno);
                        canvas_disconnect_with_undo(x, outindex, t.tr_outno, inindex, t.tr_inno);
                        canvas_connect_with_undo(x, outindex, t.tr_outno, sinindex, sinno);
                        canvas_connect_with_undo(x, soutindex, soutno, inindex, t.tr_inno);
                        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);

                        x->gl_editor->e_selectline_index1 = soutindex;
                        x->gl_editor->e_selectline_outno = soutno;
                        x->gl_editor->e_selectline_index2 = inindex;
                        x->gl_editor->e_selectline_inno = t.tr_inno;

                        canvas_dirty(x, 1);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
            }
            if (!shiftmod)
            {
                    /* !shiftmode: clear selection before selecting line */
                if (doit)
                {
                    glist_noselect(x);
                    glist_selectline(glist2, oc,
                        outindex, t.tr_outno,
                        inindex, t.tr_inno);
                }
                canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                return;
            }
        }
    }
    canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
    if (doit)
    {
        if (!shiftmod) glist_noselect(x);
        pdgui_vmess(0, "crr iiii rs",
            x, "create", "rectangle",
            xpos,ypos, xpos,ypos,
            "-tags", "x");
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
        x->gl_editor->e_onmotion = MA_REGION;
    }
}